

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

ebml_element *
EBML_MasterFindFirstElt
          (ebml_master *Element,ebml_context *Context,bool_t bCreateIfNull,bool_t SetDefault,
          int ForProfile)

{
  ebml_element *peVar1;
  ebml_element *peVar2;
  bool bVar3;
  
  if (ForProfile == 0 && SetDefault != 0) {
    __assert_fail("!SetDefault || ForProfile!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x34,
                  "ebml_element *EBML_MasterFindFirstElt(ebml_master *, const ebml_context *, bool_t, bool_t, int)"
                 );
  }
  peVar2 = (ebml_element *)(Element->Base).Base.Children;
  while ((peVar2 != (ebml_element *)0x0 && (peVar2->Context->Id != Context->Id))) {
    peVar1 = (ebml_element *)(peVar2->Base).Next;
    bVar3 = peVar2 == peVar1;
    peVar2 = peVar1;
    if (bVar3) {
      __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x36,
                    "ebml_element *EBML_MasterFindFirstElt(ebml_master *, const ebml_context *, bool_t, bool_t, int)"
                   );
    }
  }
  if (bCreateIfNull != 0 && peVar2 == (ebml_element *)0x0) {
    peVar2 = EBML_MasterAddElt(Element,Context,SetDefault,ForProfile);
    return peVar2;
  }
  return peVar2;
}

Assistant:

ebml_element *EBML_MasterFindFirstElt(ebml_master *Element, const ebml_context *Context, bool_t bCreateIfNull, bool_t SetDefault, int ForProfile)
{
    assert(!SetDefault || ForProfile!=0);
    ebml_element *i;
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
    {
        if (i->Context->Id == Context->Id)
            break;
    }

    if (!i && bCreateIfNull)
        i = EBML_MasterAddElt(Element,Context,SetDefault, ForProfile);

    return i;
}